

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O2

int google::protobuf::Fls64(uint64 n)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  LogMessage *other;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  LogFinisher local_49;
  LogMessage local_48;
  
  if (n == 0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/int128.cc"
               ,0x3b);
    other = internal::LogMessage::operator<<(&local_48,"CHECK failed: (0) != (n): ");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
  }
  uVar5 = n >> 0x20;
  uVar6 = uVar5;
  if (uVar5 == 0) {
    uVar6 = n;
  }
  iVar2 = (uint)(uVar5 != 0) * 0x20;
  uVar5 = uVar6 >> 0x10 & 0xffff;
  iVar1 = iVar2 + 0x10;
  if (uVar6 < 0x10000) {
    uVar5 = uVar6 & 0xffffffff;
    iVar1 = iVar2;
  }
  uVar3 = (uint)(uVar5 >> 8);
  iVar2 = iVar1 + 8;
  if ((uint)uVar5 < 0x100) {
    uVar3 = (uint)uVar5;
    iVar2 = iVar1;
  }
  uVar4 = uVar3 >> 4;
  iVar1 = iVar2 + 4;
  if (uVar3 < 0x10) {
    uVar4 = uVar3;
    iVar1 = iVar2;
  }
  return ((uint)(0x3333333322221100 >> ((byte)(uVar4 << 2) & 0x3f)) & 3) + iVar1;
}

Assistant:

static inline int Fls64(uint64 n) {
  GOOGLE_DCHECK_NE(0, n);
  int pos = 0;
  STEP(uint64, n, pos, 0x20);
  uint32 n32 = n;
  STEP(uint32, n32, pos, 0x10);
  STEP(uint32, n32, pos, 0x08);
  STEP(uint32, n32, pos, 0x04);
  return pos + ((GOOGLE_ULONGLONG(0x3333333322221100) >> (n32 << 2)) & 0x3);
}